

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaped_array_view.hpp
# Opt level: O0

shaped_array_view<long,_2UL> * __thiscall
burst::make_shaped_array_view<long,unsigned_long,2ul>
          (shaped_array_view<long,_2UL> *__return_storage_ptr__,burst *this,long *data,
          array<unsigned_long,_2UL> shape)

{
  unsigned_long data_00;
  array<unsigned_long,_2UL> local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  array<unsigned_long,_2UL> local_28;
  long *data_local;
  array<unsigned_long,_2UL> shape_local;
  
  shape_local._M_elems[0] = shape._M_elems[0];
  local_28._M_elems[1] = (unsigned_long)this;
  data_local = data;
  std::array<unsigned_long,_2UL>::rbegin(&local_28);
  std::array<unsigned_long,_2UL>::rend((array<unsigned_long,_2UL> *)(local_38 + 8));
  std::array<unsigned_long,_2UL>::rbegin((array<unsigned_long,_2UL> *)local_38);
  std::
  partial_sum<std::reverse_iterator<unsigned_long*>,std::reverse_iterator<unsigned_long*>,std::multiplies<void>>
            (local_48,&local_28,local_38 + 8,local_38);
  data_00 = local_28._M_elems[1];
  local_58 = detail::cast<unsigned_long,unsigned_long,2ul>((array<unsigned_long,_2UL> *)&data_local)
  ;
  shaped_array_view<long,_2UL>::shaped_array_view(__return_storage_ptr__,(long *)data_00,&local_58);
  return __return_storage_ptr__;
}

Assistant:

auto make_shaped_array_view (Value * data, std::array<Integer, Dimension> shape)
    {
        static_assert(Dimension > 0, "Размерность массива должна быть положительной");
        std::partial_sum(shape.rbegin(), shape.rend(), shape.rbegin(), std::multiplies<>{});
        return shaped_array_view<Value, Dimension>(data, detail::cast<std::size_t>(shape));
    }